

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O0

int mmk_memcmp(void *s1,void *s2,size_t n)

{
  char *local_38;
  char *s2_;
  char *s1_;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  local_38 = (char *)s2;
  s2_ = (char *)s1;
  s1_ = (char *)n;
  while( true ) {
    if (s1_ == (char *)0x0) {
      return 0;
    }
    if (*s2_ != *local_38) break;
    s2_ = s2_ + 1;
    local_38 = local_38 + 1;
    s1_ = s1_ + -1;
  }
  if (*local_38 <= *s2_) {
    return 1;
  }
  return -1;
}

Assistant:

int mmk_memcmp(const void *s1, const void *s2, size_t n)
{
    for (const char *s1_ = s1, *s2_ = s2; n; ++s1_, ++s2_, --n)
        if (*s1_ != *s2_)
            return *s1_ < *s2_ ? -1 : 1;
    return 0;
}